

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebuilder.cc
# Opt level: O0

void __thiscall Typelib::TypeBuilder::addPointer(TypeBuilder *this,int level)

{
  Registry *pRVar1;
  Type *pTVar2;
  allocator local_99;
  string local_98 [32];
  Type *local_78;
  Type *new_type;
  undefined1 local_60 [32];
  undefined1 local_40 [40];
  Type *base_type;
  TypeBuilder *pTStack_10;
  int level_local;
  TypeBuilder *this_local;
  
  pTStack_10 = this;
  for (base_type._4_4_ = level; base_type._4_4_ != 0; base_type._4_4_ = base_type._4_4_ + -1) {
    pRVar1 = this->m_registry;
    Type::getName_abi_cxx11_((Type *)local_60);
    Pointer::getPointerName((Pointer *)local_40,(string *)local_60);
    pTVar2 = Registry::get_(pRVar1,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string((string *)local_60);
    local_40._32_8_ = pTVar2;
    if (pTVar2 == (Type *)0x0) {
      pTVar2 = (Type *)operator_new(0x48);
      Pointer::Pointer((Pointer *)pTVar2,this->m_type);
      pRVar1 = this->m_registry;
      local_78 = pTVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"",&local_99);
      Registry::add(pRVar1,pTVar2,(string *)local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      this->m_type = local_78;
    }
    else {
      this->m_type = pTVar2;
    }
  }
  return;
}

Assistant:

void TypeBuilder::addPointer(int level)
    {
        for (; level; --level)
        {
            // Try to get the type object in the registry
            Type* base_type = m_registry.get_(Pointer::getPointerName(m_type->getName()));
            if (base_type)
                m_type = base_type;
            else
            {
                Type* new_type = new Pointer(*m_type);
                m_registry.add(new_type);
                m_type = new_type;
            }
        }
    }